

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureImmutableFormatCase::test
          (TextureImmutableFormatCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  GLenum GVar1;
  ScopedLogSection SVar2;
  deBool dVar3;
  TestLog *pTVar4;
  Enum<int,_2UL> EVar5;
  GetNameFunc local_608;
  int local_600;
  string local_5f8;
  allocator<char> local_5d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  GLenum local_54c;
  GetNameFunc p_Stack_548;
  deUint32 err_5;
  int local_540;
  GetNameFunc local_538;
  int local_530;
  string local_528;
  allocator<char> local_501;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  GLenum local_47c;
  GetNameFunc p_Stack_478;
  deUint32 err_4;
  int local_470;
  GetNameFunc local_468;
  int local_460;
  string local_458;
  allocator<char> local_431;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  GLenum local_3ac;
  GLuint local_3a8;
  deUint32 err_3;
  GLuint textureID_1;
  allocator<char> local_379;
  string local_378;
  ScopedLogSection local_358;
  ScopedLogSection subsection_1;
  TestLog *local_340;
  int local_338;
  string local_330;
  allocator<char> local_309;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  GLenum local_284;
  GetNameFunc p_Stack_280;
  deUint32 err_2;
  int local_278;
  GetNameFunc local_270;
  int local_268;
  string local_260;
  allocator<char> local_239;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  GLenum local_1b4;
  GetNameFunc p_Stack_1b0;
  deUint32 err_1;
  int local_1a8;
  GetNameFunc local_1a0;
  int local_198;
  string local_190;
  allocator<char> local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  GLenum local_e4;
  GLuint local_e0;
  deUint32 err;
  GLuint textureID;
  allocator<char> local_b1;
  string local_b0;
  ScopedLogSection local_90;
  ScopedLogSection subsection;
  string local_80;
  allocator<char> local_49;
  string local_48;
  ScopedLogSection local_28;
  ScopedLogSection section;
  ResultCollector *result_local;
  CallLogWrapper *gl_local;
  TextureImmutableFormatCase *this_local;
  
  section.m_log = (TestLog *)result;
  pTVar4 = tcu::TestContext::getLog
                     ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Initial",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"Initial",(allocator<char> *)((long)&subsection.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_28,pTVar4,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&subsection.m_log + 7));
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  StateQueryUtil::verifyStateTextureParamInteger
            ((ResultCollector *)section.m_log,gl,(this->super_TextureTest).m_target,
             (this->super_TextureTest).m_pname,0,(this->super_TextureTest).m_type);
  tcu::ScopedLogSection::~ScopedLogSection(&local_28);
  pTVar4 = tcu::TestContext::getLog
                     ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"Immutable",&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&textureID,"Immutable",(allocator<char> *)((long)&err + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_90,pTVar4,&local_b0,(string *)&textureID);
  std::__cxx11::string::~string((string *)&textureID);
  std::allocator<char>::~allocator((allocator<char> *)((long)&err + 3));
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  local_e0 = 0;
  glu::CallLogWrapper::glGenTextures(gl,1,&local_e0);
  glu::CallLogWrapper::glBindTexture(gl,(this->super_TextureTest).m_target,local_e0);
  do {
    local_e4 = glu::CallLogWrapper::glGetError(gl);
    SVar2 = section;
    if (local_e4 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,"Got Error ",&local_169);
      EVar5 = glu::getErrorStr(local_e4);
      p_Stack_1b0 = EVar5.m_getName;
      local_1a8 = EVar5.m_value;
      local_1a0 = p_Stack_1b0;
      local_198 = local_1a8;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_190,&local_1a0);
      std::operator+(&local_148,&local_168,&local_190);
      std::operator+(&local_128,&local_148,": ");
      std::operator+(&local_108,&local_128,"glBindTexture");
      tcu::ResultCollector::fail((ResultCollector *)SVar2.m_log,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  GVar1 = (this->super_TextureTest).m_target;
  if (GVar1 == 0xde1) {
LAB_00f49011:
    glu::CallLogWrapper::glTexStorage2D(gl,(this->super_TextureTest).m_target,1,0x8058,0x20,0x20);
  }
  else if (GVar1 == 0x806f) {
LAB_00f4903e:
    glu::CallLogWrapper::glTexStorage3D(gl,(this->super_TextureTest).m_target,1,0x8058,0x20,0x20,8);
  }
  else {
    if (GVar1 == 0x8513) goto LAB_00f49011;
    if (GVar1 == 0x8c1a) goto LAB_00f4903e;
    if (GVar1 == 0x9009) {
      glu::CallLogWrapper::glTexStorage3D
                (gl,(this->super_TextureTest).m_target,1,0x8058,0x20,0x20,0xc);
    }
    else if (GVar1 == 0x9100) {
      glu::CallLogWrapper::glTexStorage2DMultisample
                (gl,(this->super_TextureTest).m_target,2,0x8051,0x40,0x40,'\0');
    }
    else if (GVar1 == 0x9102) {
      glu::CallLogWrapper::glTexStorage3DMultisample
                (gl,(this->super_TextureTest).m_target,2,0x8051,0x40,0x40,2,'\0');
    }
  }
  do {
    local_1b4 = glu::CallLogWrapper::glGetError(gl);
    SVar2 = section;
    if (local_1b4 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"Got Error ",&local_239);
      EVar5 = glu::getErrorStr(local_1b4);
      p_Stack_280 = EVar5.m_getName;
      local_278 = EVar5.m_value;
      local_270 = p_Stack_280;
      local_268 = local_278;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_260,&local_270);
      std::operator+(&local_218,&local_238,&local_260);
      std::operator+(&local_1f8,&local_218,": ");
      std::operator+(&local_1d8,&local_1f8,"setup texture");
      tcu::ResultCollector::fail((ResultCollector *)SVar2.m_log,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_238);
      std::allocator<char>::~allocator(&local_239);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  StateQueryUtil::verifyStateTextureParamInteger
            ((ResultCollector *)section.m_log,gl,(this->super_TextureTest).m_target,
             (this->super_TextureTest).m_pname,1,(this->super_TextureTest).m_type);
  glu::CallLogWrapper::glDeleteTextures(gl,1,&local_e0);
  do {
    local_284 = glu::CallLogWrapper::glGetError(gl);
    SVar2 = section;
    if (local_284 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_308,"Got Error ",&local_309);
      EVar5 = glu::getErrorStr(local_284);
      subsection_1.m_log = (TestLog *)EVar5.m_getName;
      local_338 = EVar5.m_value;
      local_340 = subsection_1.m_log;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_330,&local_340);
      std::operator+(&local_2e8,&local_308,&local_330);
      std::operator+(&local_2c8,&local_2e8,": ");
      std::operator+(&local_2a8,&local_2c8,"glDeleteTextures");
      tcu::ResultCollector::fail((ResultCollector *)SVar2.m_log,&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_308);
      std::allocator<char>::~allocator(&local_309);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ScopedLogSection::~ScopedLogSection(&local_90);
  if ((this->super_TextureTest).m_target == 0x9100) {
    return;
  }
  if ((this->super_TextureTest).m_target == 0x9102) {
    return;
  }
  pTVar4 = tcu::TestContext::getLog
                     ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"Mutable",&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&textureID_1,"Mutable",(allocator<char> *)((long)&err_3 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_358,pTVar4,&local_378,(string *)&textureID_1);
  std::__cxx11::string::~string((string *)&textureID_1);
  std::allocator<char>::~allocator((allocator<char> *)((long)&err_3 + 3));
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  local_3a8 = 0;
  glu::CallLogWrapper::glGenTextures(gl,1,&local_3a8);
  glu::CallLogWrapper::glBindTexture(gl,(this->super_TextureTest).m_target,local_3a8);
  do {
    local_3ac = glu::CallLogWrapper::glGetError(gl);
    SVar2 = section;
    if (local_3ac != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_430,"Got Error ",&local_431);
      EVar5 = glu::getErrorStr(local_3ac);
      p_Stack_478 = EVar5.m_getName;
      local_470 = EVar5.m_value;
      local_468 = p_Stack_478;
      local_460 = local_470;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_458,&local_468);
      std::operator+(&local_410,&local_430,&local_458);
      std::operator+(&local_3f0,&local_410,": ");
      std::operator+(&local_3d0,&local_3f0,"glBindTexture");
      tcu::ResultCollector::fail((ResultCollector *)SVar2.m_log,&local_3d0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&local_430);
      std::allocator<char>::~allocator(&local_431);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  GVar1 = (this->super_TextureTest).m_target;
  if (GVar1 == 0xde1) {
    glu::CallLogWrapper::glTexImage2D
              (gl,(this->super_TextureTest).m_target,0,0x8058,0x20,0x20,0,0x1908,0x1401,(void *)0x0)
    ;
    goto LAB_00f49b29;
  }
  if (GVar1 != 0x806f) {
    if (GVar1 == 0x8513) {
      glu::CallLogWrapper::glTexImage2D(gl,0x8518,0,0x8058,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
      goto LAB_00f49b29;
    }
    if (GVar1 != 0x8c1a) {
      if (GVar1 == 0x9009) {
        glu::CallLogWrapper::glTexImage3D
                  (gl,(this->super_TextureTest).m_target,0,0x8058,0x20,0x20,0xc,0,0x1908,0x1401,
                   (void *)0x0);
      }
      goto LAB_00f49b29;
    }
  }
  glu::CallLogWrapper::glTexImage3D
            (gl,(this->super_TextureTest).m_target,0,0x8058,0x20,0x20,8,0,0x1908,0x1401,(void *)0x0)
  ;
LAB_00f49b29:
  do {
    local_47c = glu::CallLogWrapper::glGetError(gl);
    SVar2 = section;
    if (local_47c != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_500,"Got Error ",&local_501);
      EVar5 = glu::getErrorStr(local_47c);
      p_Stack_548 = EVar5.m_getName;
      local_540 = EVar5.m_value;
      local_538 = p_Stack_548;
      local_530 = local_540;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_528,&local_538);
      std::operator+(&local_4e0,&local_500,&local_528);
      std::operator+(&local_4c0,&local_4e0,": ");
      std::operator+(&local_4a0,&local_4c0,"setup texture");
      tcu::ResultCollector::fail((ResultCollector *)SVar2.m_log,&local_4a0);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::~string((string *)&local_500);
      std::allocator<char>::~allocator(&local_501);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  StateQueryUtil::verifyStateTextureParamInteger
            ((ResultCollector *)section.m_log,gl,(this->super_TextureTest).m_target,
             (this->super_TextureTest).m_pname,0,(this->super_TextureTest).m_type);
  glu::CallLogWrapper::glDeleteTextures(gl,1,&local_3a8);
  do {
    local_54c = glu::CallLogWrapper::glGetError(gl);
    SVar2 = section;
    if (local_54c != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5d0,"Got Error ",&local_5d1);
      EVar5 = glu::getErrorStr(local_54c);
      local_608 = EVar5.m_getName;
      local_600 = EVar5.m_value;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_5f8,&local_608);
      std::operator+(&local_5b0,&local_5d0,&local_5f8);
      std::operator+(&local_590,&local_5b0,": ");
      std::operator+(&local_570,&local_590,"glDeleteTextures");
      tcu::ResultCollector::fail((ResultCollector *)SVar2.m_log,&local_570);
      std::__cxx11::string::~string((string *)&local_570);
      std::__cxx11::string::~string((string *)&local_590);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::__cxx11::string::~string((string *)&local_5f8);
      std::__cxx11::string::~string((string *)&local_5d0);
      std::allocator<char>::~allocator(&local_5d1);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ScopedLogSection::~ScopedLogSection(&local_358);
  return;
}

Assistant:

void TextureImmutableFormatCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, 0, m_type);
	}

	{
		const tcu::ScopedLogSection	subsection	(m_testCtx.getLog(), "Immutable", "Immutable");
		GLuint						textureID	= 0;

		gl.glGenTextures(1, &textureID);
		gl.glBindTexture(m_target, textureID);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindTexture");

		switch (m_target)
		{
			case GL_TEXTURE_2D:
			case GL_TEXTURE_CUBE_MAP:
			{
				gl.glTexStorage2D(m_target, 1, GL_RGBA8, 32, 32);
				break;
			}
			case GL_TEXTURE_2D_ARRAY:
			case GL_TEXTURE_3D:
			{
				gl.glTexStorage3D(m_target, 1, GL_RGBA8, 32, 32, 8);
				break;
			}
			case GL_TEXTURE_2D_MULTISAMPLE:
			{
				gl.glTexStorage2DMultisample(m_target, 2, GL_RGB8, 64, 64, GL_FALSE);
				break;
			}
			case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
			{
				gl.glTexStorage3DMultisample(m_target, 2, GL_RGB8, 64, 64, 2, GL_FALSE);
				break;
			}
			case GL_TEXTURE_CUBE_MAP_ARRAY:
			{
				gl.glTexStorage3D(m_target, 1, GL_RGBA8, 32, 32, 6 * 2);
				break;
			}
			default:
				DE_ASSERT(false);
		}
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "setup texture");

		verifyStateTextureParamInteger(result, gl, m_target, m_pname, 1, m_type);

		gl.glDeleteTextures(1, &textureID);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteTextures");
	}

	// no mutable
	if (m_target == GL_TEXTURE_2D_MULTISAMPLE ||
		m_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
		return;

	// test mutable
	{
		const tcu::ScopedLogSection	subsection		(m_testCtx.getLog(), "Mutable", "Mutable");
		GLuint						textureID		= 0;

		gl.glGenTextures(1, &textureID);
		gl.glBindTexture(m_target, textureID);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindTexture");

		switch (m_target)
		{
			case GL_TEXTURE_2D:
			{
				gl.glTexImage2D(m_target, 0, GL_RGBA8, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
				break;
			}
			case GL_TEXTURE_CUBE_MAP:
			{
				gl.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, GL_RGBA8, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
				break;
			}
			case GL_TEXTURE_2D_ARRAY:
			case GL_TEXTURE_3D:
			{
				gl.glTexImage3D(m_target, 0, GL_RGBA8, 32, 32, 8, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
				break;
			}
			case GL_TEXTURE_CUBE_MAP_ARRAY:
			{
				gl.glTexImage3D(m_target, 0, GL_RGBA8, 32, 32, 6 * 2, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
				break;
			}
			default:
				DE_ASSERT(false);
		}
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "setup texture");

		verifyStateTextureParamInteger(result, gl, m_target, m_pname, 0, m_type);

		gl.glDeleteTextures(1, &textureID);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteTextures");
	}
}